

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  uint uVar2;
  BufferMode BVar3;
  TestContext *pTVar4;
  Context *pCVar5;
  int iVar6;
  _Alloc_hider _Var7;
  int extraout_EAX;
  TestNode *pTVar8;
  char *pcVar9;
  BlockSingleStructCase *pBVar10;
  TestNode *pTVar11;
  BlockSingleStructArrayCase *pBVar12;
  TestNode *pTVar13;
  BlockSingleNestedStructCase *pBVar14;
  BlockSingleNestedStructArrayCase *pBVar15;
  BlockMultiBasicTypesCase *pBVar16;
  BlockMultiNestedStructCase *pBVar17;
  anon_struct_16_2_f7718127 *paVar18;
  uint uVar19;
  anon_struct_16_2_f7718127 *paVar20;
  TestNode *pTVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  TestNode *pTVar25;
  uint uVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  TestNode *local_108;
  TestNode *local_100;
  anon_struct_16_2_f7718127 *local_f8;
  anon_struct_16_2_f7718127 *local_f0;
  TestNode *local_e8;
  string baseName;
  allocator<char> local_b1;
  TestNode *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  VarType local_48;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_b0 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar24 = 0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_100 = pTVar8;
    if (lVar24 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::layoutFlags[lVar24].name,"");
    tcu::TestNode::addChild(local_b0,pTVar8);
    pTVar8 = (TestNode *)0x0;
    while (pTVar8 != (TestNode *)0x19) {
      DVar1 = init::basicTypes[(long)pTVar8];
      local_e8 = pTVar8;
      pcVar9 = glu::getDataTypeName(DVar1);
      if (DVar1 - TYPE_BOOL < 4) {
        pCVar5 = (this->super_TestCaseGroup).m_context;
        deqp::gls::ub::VarType::VarType((VarType *)&baseName,DVar1,0);
        createBlockBasicTypeCases
                  ((TestCaseGroup *)local_100,pCVar5,pcVar9,(VarType *)&baseName,
                   init::layoutFlags[lVar24].flags,0);
        deqp::gls::ub::VarType::~VarType((VarType *)&baseName);
      }
      else {
        lVar22 = 8;
        while( true ) {
          if (lVar22 == 0x38) break;
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,*(char **)(&UNK_00c12a28 + lVar22),
                     (allocator<char> *)&local_88);
          std::operator+(&local_128,&local_a8,"_");
          std::operator+(&baseName,&local_128,pcVar9);
          _Var7 = baseName._M_dataplus;
          deqp::gls::ub::VarType::VarType
                    ((VarType *)&local_68,DVar1,
                     *(deUint32 *)((long)&init::precisionFlags[0].name + lVar22));
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_100,pCVar5,_Var7._M_p,(VarType *)&local_68,
                     init::layoutFlags[lVar24].flags,0);
          deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
          std::__cxx11::string::~string((string *)&baseName);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_a8);
          lVar22 = lVar22 + 0x10;
        }
      }
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        pTVar8 = (TestNode *)0x0;
        while (pTVar8 != (TestNode *)0x2) {
          local_f8 = init::matrixFlags + (long)pTVar8;
          local_f0 = (anon_struct_16_2_f7718127 *)init::matrixFlags[(long)pTVar8].name;
          local_108 = pTVar8;
          for (lVar22 = 8; lVar22 != 0x38; lVar22 = lVar22 + 0x10) {
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,(char *)local_f0,&local_b1);
            std::operator+(&local_68,&local_88,"_");
            std::operator+(&local_a8,&local_68,*(char **)(&UNK_00c12a28 + lVar22));
            std::operator+(&local_128,&local_a8,"_");
            std::operator+(&baseName,&local_128,pcVar9);
            _Var7 = baseName._M_dataplus;
            deqp::gls::ub::VarType::VarType
                      (&local_48,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar22));
            createBlockBasicTypeCases
                      ((TestCaseGroup *)local_100,pCVar5,_Var7._M_p,&local_48,
                       local_f8->flags | init::layoutFlags[lVar24].flags,0);
            deqp::gls::ub::VarType::~VarType(&local_48);
            std::__cxx11::string::~string((string *)&baseName);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_68);
            std::__cxx11::string::~string((string *)&local_88);
          }
          pTVar8 = (TestNode *)((long)&local_108->_vptr_TestNode + 1);
        }
      }
      pTVar8 = (TestNode *)((long)&local_e8->_vptr_TestNode + 1);
    }
    lVar24 = lVar24 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"single_basic_array",
             "Single basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  paVar20 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_108 = pTVar8;
    if (paVar20 == (anon_struct_16_2_f7718127 *)0x3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::layoutFlags[(long)paVar20].name,"");
    tcu::TestNode::addChild(local_100,pTVar8);
    local_f8 = paVar20;
    local_f0 = init::layoutFlags + (long)paVar20;
    for (lVar24 = 0; lVar24 != 0x19; lVar24 = lVar24 + 1) {
      DVar1 = init::basicTypes[lVar24];
      pcVar9 = glu::getDataTypeName(DVar1);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      deqp::gls::ub::VarType::VarType
                ((VarType *)&local_128,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      deqp::gls::ub::VarType::VarType((VarType *)&baseName,(VarType *)&local_128,3);
      uVar2 = local_f0->flags;
      createBlockBasicTypeCases((TestCaseGroup *)pTVar8,pCVar5,pcVar9,(VarType *)&baseName,uVar2,0);
      deqp::gls::ub::VarType::~VarType((VarType *)&baseName);
      deqp::gls::ub::VarType::~VarType((VarType *)&local_128);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        for (lVar22 = 0; lVar22 != 0x20; lVar22 = lVar22 + 0x10) {
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,*(char **)((long)&init::matrixFlags[0].name + lVar22),
                     (allocator<char> *)&local_48);
          std::operator+(&local_128,&local_a8,"_");
          std::operator+(&baseName,&local_128,pcVar9);
          _Var7 = baseName._M_dataplus;
          deqp::gls::ub::VarType::VarType((VarType *)&local_88,DVar1,4);
          deqp::gls::ub::VarType::VarType((VarType *)&local_68,(VarType *)&local_88,3);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_108,pCVar5,_Var7._M_p,(VarType *)&local_68,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar22) | uVar2,0);
          deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
          deqp::gls::ub::VarType::~VarType((VarType *)&local_88);
          std::__cxx11::string::~string((string *)&baseName);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      pTVar8 = local_108;
    }
    paVar20 = (anon_struct_16_2_f7718127 *)((long)&local_f8->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  paVar20 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (paVar20 == (anon_struct_16_2_f7718127 *)0x2) break;
    local_f0 = paVar20;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::bufferModes[(long)paVar20].name,"");
    pTVar13 = (TestNode *)(init::bufferModes + (long)paVar20);
    tcu::TestNode::addChild(local_108,pTVar8);
    pTVar11 = (TestNode *)0x0;
    paVar20 = local_f0;
    local_100 = pTVar13;
    while (pTVar11 != (TestNode *)0x3) {
      local_f8 = init::layoutFlags + (long)pTVar11;
      pcVar9 = init::layoutFlags[(long)pTVar11].name;
      local_e8 = pTVar11;
      for (iVar23 = 0; iVar23 != 2; iVar23 = iVar23 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,pcVar9,(allocator<char> *)&local_128);
        BVar3 = *(BufferMode *)&pTVar13->m_testCtx;
        if (BVar3 != BUFFERMODE_SINGLE || iVar23 != 0) {
          uVar2 = local_f8->flags;
          if (iVar23 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pBVar10 = (BlockSingleStructCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_vertex");
          iVar6 = (uint)(iVar23 != 0) * 3;
          BlockSingleStructCase::BlockSingleStructCase
                    (pBVar10,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x100,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
          std::__cxx11::string::~string((string *)&local_128);
          pBVar10 = (BlockSingleStructCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_fragment");
          BlockSingleStructCase::BlockSingleStructCase
                    (pBVar10,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x200,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
          std::__cxx11::string::~string((string *)&local_128);
          paVar20 = local_f0;
          if ((uVar2 & 0x10) == 0) {
            pBVar10 = (BlockSingleStructCase *)operator_new(0xb8);
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_128,&baseName,"_both");
            BlockSingleStructCase::BlockSingleStructCase
                      (pBVar10,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,BVar3,iVar6);
            tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
            std::__cxx11::string::~string((string *)&local_128);
            paVar20 = local_f0;
          }
        }
        std::__cxx11::string::~string((string *)&baseName);
        pTVar13 = local_100;
      }
      pTVar11 = (TestNode *)((long)&local_e8->_vptr_TestNode + 1);
    }
    paVar20 = (anon_struct_16_2_f7718127 *)((long)&paVar20->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"single_struct_array",
             "Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  pTVar13 = (TestNode *)0x0;
  while( true ) {
    pTVar11 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_100 = pTVar11;
    if (pTVar13 == (TestNode *)0x2) break;
    local_108 = pTVar13;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar4,init::bufferModes[(long)pTVar13].name,"");
    local_f8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + (long)pTVar13);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    pTVar13 = local_108;
    for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
      local_e8 = (TestNode *)(init::layoutFlags + lVar24);
      local_f0 = (anon_struct_16_2_f7718127 *)init::layoutFlags[lVar24].name;
      for (iVar23 = 0; iVar23 != 2; iVar23 = iVar23 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_f0,(allocator<char> *)&local_128);
        BVar3 = local_f8->flags;
        if (BVar3 != BUFFERMODE_SINGLE || iVar23 != 0) {
          uVar2 = *(uint *)&local_e8->m_testCtx;
          if (iVar23 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pBVar12 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_vertex");
          iVar6 = (uint)(iVar23 != 0) * 3;
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (pBVar12,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x100,BVar3,iVar6);
          tcu::TestNode::addChild(local_100,(TestNode *)pBVar12);
          std::__cxx11::string::~string((string *)&local_128);
          pBVar12 = (BlockSingleStructArrayCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_fragment");
          BlockSingleStructArrayCase::BlockSingleStructArrayCase
                    (pBVar12,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x200,BVar3,iVar6);
          tcu::TestNode::addChild(local_100,(TestNode *)pBVar12);
          std::__cxx11::string::~string((string *)&local_128);
          pTVar13 = local_108;
          if ((uVar2 & 0x10) == 0) {
            pBVar12 = (BlockSingleStructArrayCase *)operator_new(0xb8);
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_128,&baseName,"_both");
            BlockSingleStructArrayCase::BlockSingleStructArrayCase
                      (pBVar12,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,BVar3,iVar6);
            tcu::TestNode::addChild(local_100,(TestNode *)pBVar12);
            std::__cxx11::string::~string((string *)&local_128);
            pTVar13 = local_108;
          }
        }
        std::__cxx11::string::~string((string *)&baseName);
      }
    }
    pTVar13 = (TestNode *)((long)&pTVar13->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar4,"single_nested_struct",
             "Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  pTVar8 = (TestNode *)0x0;
  while( true ) {
    pTVar13 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (pTVar8 == (TestNode *)0x2) break;
    local_108 = pTVar8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar13,pTVar4,init::bufferModes[(long)pTVar8].name,"");
    local_f8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + (long)pTVar8);
    tcu::TestNode::addChild(local_100,pTVar13);
    pTVar8 = local_108;
    for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
      local_e8 = (TestNode *)(init::layoutFlags + lVar24);
      local_f0 = (anon_struct_16_2_f7718127 *)init::layoutFlags[lVar24].name;
      for (iVar23 = 0; iVar23 != 2; iVar23 = iVar23 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_f0,(allocator<char> *)&local_128);
        BVar3 = local_f8->flags;
        if (BVar3 != BUFFERMODE_SINGLE || iVar23 != 0) {
          uVar2 = *(uint *)&local_e8->m_testCtx;
          if (iVar23 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pBVar14 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_vertex");
          iVar6 = (uint)(iVar23 != 0) * 3;
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (pBVar14,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x100,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar14);
          std::__cxx11::string::~string((string *)&local_128);
          pBVar14 = (BlockSingleNestedStructCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_fragment");
          BlockSingleNestedStructCase::BlockSingleNestedStructCase
                    (pBVar14,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x200,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar14);
          std::__cxx11::string::~string((string *)&local_128);
          pTVar8 = local_108;
          if ((uVar2 & 0x10) == 0) {
            pBVar14 = (BlockSingleNestedStructCase *)operator_new(0xb8);
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_128,&baseName,"_both");
            BlockSingleNestedStructCase::BlockSingleNestedStructCase
                      (pBVar14,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,BVar3,iVar6);
            tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar14);
            std::__cxx11::string::~string((string *)&local_128);
            pTVar8 = local_108;
          }
        }
        std::__cxx11::string::~string((string *)&baseName);
      }
    }
    pTVar8 = (TestNode *)((long)&pTVar8->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,pTVar4,"single_nested_struct_array",
             "Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  paVar20 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar8 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (paVar20 == (anon_struct_16_2_f7718127 *)0x2) break;
    local_f8 = paVar20;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,pTVar4,init::bufferModes[(long)paVar20].name,"");
    paVar20 = (anon_struct_16_2_f7718127 *)(init::bufferModes + (long)paVar20);
    tcu::TestNode::addChild(pTVar13,pTVar8);
    pTVar11 = (TestNode *)0x0;
    paVar18 = local_f8;
    local_f0 = paVar20;
    while (pTVar11 != (TestNode *)0x3) {
      local_108 = (TestNode *)(init::layoutFlags + (long)pTVar11);
      local_100 = (TestNode *)init::layoutFlags[(long)pTVar11].name;
      local_e8 = pTVar11;
      for (iVar23 = 0; iVar23 != 2; iVar23 = iVar23 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_100,(allocator<char> *)&local_128);
        BVar3 = paVar20->flags;
        if (BVar3 != BUFFERMODE_SINGLE || iVar23 != 0) {
          uVar2 = *(uint *)&local_108->m_testCtx;
          if (iVar23 != 0) {
            std::__cxx11::string::append((char *)&baseName);
          }
          pBVar15 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_vertex");
          iVar6 = (uint)(iVar23 != 0) * 3;
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (pBVar15,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x100,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar15);
          std::__cxx11::string::~string((string *)&local_128);
          pBVar15 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_fragment");
          BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                    (pBVar15,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x200,BVar3,iVar6);
          tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar15);
          std::__cxx11::string::~string((string *)&local_128);
          paVar18 = local_f8;
          if ((uVar2 & 0x10) == 0) {
            pBVar15 = (BlockSingleNestedStructArrayCase *)operator_new(0xb8);
            pCVar5 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_128,&baseName,"_both");
            BlockSingleNestedStructArrayCase::BlockSingleNestedStructArrayCase
                      (pBVar15,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,BVar3,iVar6);
            tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar15);
            std::__cxx11::string::~string((string *)&local_128);
            paVar18 = local_f8;
          }
        }
        std::__cxx11::string::~string((string *)&baseName);
        paVar20 = local_f0;
      }
      pTVar11 = (TestNode *)((long)&local_e8->_vptr_TestNode + 1);
    }
    paVar20 = (anon_struct_16_2_f7718127 *)((long)&paVar18->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,pTVar4,"instance_array_basic_type",
             "Single basic variable in instance array");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  paVar20 = (anon_struct_16_2_f7718127 *)0x0;
  while( true ) {
    pTVar13 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    local_e8 = pTVar13;
    if (paVar20 == (anon_struct_16_2_f7718127 *)0x3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar13,pTVar4,init::layoutFlags[(long)paVar20].name,"");
    tcu::TestNode::addChild(pTVar8,pTVar13);
    paVar18 = (anon_struct_16_2_f7718127 *)0x0;
    local_108 = (TestNode *)(init::layoutFlags + (long)paVar20);
    local_f8 = paVar20;
    while (pTVar13 = local_108, paVar18 != (anon_struct_16_2_f7718127 *)0x19) {
      DVar1 = init::basicTypes[(long)paVar18];
      local_f0 = paVar18;
      pcVar9 = glu::getDataTypeName(DVar1);
      pCVar5 = (this->super_TestCaseGroup).m_context;
      deqp::gls::ub::VarType::VarType((VarType *)&baseName,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2)
      ;
      local_100 = (TestNode *)CONCAT44(local_100._4_4_,*(deUint32 *)&pTVar13->m_testCtx);
      createBlockBasicTypeCases
                ((TestCaseGroup *)local_e8,pCVar5,pcVar9,(VarType *)&baseName,
                 *(deUint32 *)&pTVar13->m_testCtx,3);
      deqp::gls::ub::VarType::~VarType((VarType *)&baseName);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        for (lVar24 = 0; lVar24 != 0x20; lVar24 = lVar24 + 0x10) {
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,*(char **)((long)&init::matrixFlags[0].name + lVar24),
                     (allocator<char> *)&local_88);
          std::operator+(&local_128,&local_a8,"_");
          std::operator+(&baseName,&local_128,pcVar9);
          _Var7 = baseName._M_dataplus;
          deqp::gls::ub::VarType::VarType((VarType *)&local_68,DVar1,4);
          createBlockBasicTypeCases
                    ((TestCaseGroup *)local_e8,pCVar5,_Var7._M_p,(VarType *)&local_68,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar24) | (uint)local_100,3);
          deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
          std::__cxx11::string::~string((string *)&baseName);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      paVar18 = (anon_struct_16_2_f7718127 *)((long)&local_f0->name + 1);
    }
    paVar20 = (anon_struct_16_2_f7718127 *)((long)&local_f8->name + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,pTVar4,"multi_basic_types","Multiple buffers with basic types"
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  pTVar8 = (TestNode *)0x0;
  while( true ) {
    pTVar13 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (pTVar8 == (TestNode *)0x2) break;
    local_b0 = pTVar8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar13,pTVar4,init::bufferModes[(long)pTVar8].name,"");
    local_108 = (TestNode *)(init::bufferModes + (long)pTVar8);
    tcu::TestNode::addChild(local_e8,pTVar13);
    for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
      local_f8 = init::layoutFlags + lVar24;
      local_f0 = (anon_struct_16_2_f7718127 *)init::layoutFlags[lVar24].name;
      iVar23 = 2;
      while (local_100 = (TestNode *)CONCAT44(local_100._4_4_,iVar23 + -1), iVar23 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_f0,(allocator<char> *)&local_128);
        uVar2 = local_f8->flags;
        if (iVar23 != 2) {
          std::__cxx11::string::append((char *)&baseName);
        }
        pBVar16 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_vertex");
        uVar26 = uVar2 | 0x100;
        BVar3 = *(BufferMode *)&local_108->m_testCtx;
        iVar23 = (uint)(iVar23 != 2) * 3;
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar16,pCVar5,local_128._M_dataplus._M_p,"",uVar26,uVar26,BVar3,iVar23);
        tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar16);
        std::__cxx11::string::~string((string *)&local_128);
        pBVar16 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_fragment");
        uVar19 = uVar2 | 0x200;
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar16,pCVar5,local_128._M_dataplus._M_p,"",uVar19,uVar19,BVar3,iVar23);
        tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar16);
        std::__cxx11::string::~string((string *)&local_128);
        if ((uVar2 & 0x10) == 0) {
          pBVar16 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_both");
          BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                    (pBVar16,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,uVar2 | 0x300,BVar3,
                     iVar23);
          tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar16);
          std::__cxx11::string::~string((string *)&local_128);
        }
        pBVar16 = (BlockMultiBasicTypesCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_mixed");
        BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
                  (pBVar16,pCVar5,local_128._M_dataplus._M_p,"",uVar26,uVar19,BVar3,iVar23);
        tcu::TestNode::addChild(pTVar13,(TestNode *)pBVar16);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&baseName);
        iVar23 = (uint)local_100;
      }
    }
    pTVar8 = (TestNode *)((long)&local_b0->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,pTVar4,"multi_nested_struct",
             "Multiple buffers with nested structs");
  tcu::TestNode::addChild((TestNode *)this,pTVar13);
  pTVar8 = (TestNode *)0x0;
  while( true ) {
    pTVar11 = (TestNode *)operator_new(0x70);
    pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (pTVar8 == (TestNode *)0x2) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar4,init::bufferModes[(long)pTVar8].name,"");
    tcu::TestNode::addChild(pTVar13,pTVar11);
    pTVar21 = (TestNode *)0x0;
    pTVar25 = pTVar8;
    local_b0 = pTVar8;
    while (pTVar21 != (TestNode *)0x3) {
      local_108 = (TestNode *)(init::layoutFlags + (long)pTVar21);
      local_f8 = (anon_struct_16_2_f7718127 *)init::layoutFlags[(long)pTVar21].name;
      local_e8 = pTVar21;
      iVar23 = 2;
      while (local_f0 = (anon_struct_16_2_f7718127 *)CONCAT44(local_f0._4_4_,iVar23 + -1),
            iVar23 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&baseName,(char *)local_f8,(allocator<char> *)&local_128);
        uVar2 = *(uint *)&local_108->m_testCtx;
        if (iVar23 != 2) {
          std::__cxx11::string::append((char *)&baseName);
        }
        pBVar17 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_vertex");
        uVar26 = uVar2 | 0x100;
        BVar3 = init::bufferModes[(long)pTVar8].mode;
        uVar19 = (uint)(iVar23 != 2) * 3;
        local_100 = (TestNode *)(ulong)uVar19;
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar17,pCVar5,local_128._M_dataplus._M_p,"",uVar26,uVar26,BVar3,uVar19);
        tcu::TestNode::addChild(pTVar11,(TestNode *)pBVar17);
        std::__cxx11::string::~string((string *)&local_128);
        pBVar17 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_fragment");
        uVar19 = uVar2 | 0x200;
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar17,pCVar5,local_128._M_dataplus._M_p,"",uVar19,uVar19,BVar3,(int)local_100);
        tcu::TestNode::addChild(pTVar11,(TestNode *)pBVar17);
        std::__cxx11::string::~string((string *)&local_128);
        if ((uVar2 & 0x10) == 0) {
          pBVar17 = (BlockMultiNestedStructCase *)operator_new(0xc0);
          pCVar5 = (this->super_TestCaseGroup).m_context;
          std::operator+(&local_128,&baseName,"_both");
          BlockMultiNestedStructCase::BlockMultiNestedStructCase
                    (pBVar17,pCVar5,local_128._M_dataplus._M_p,"",uVar2 | 0x300,uVar2 | 0x300,BVar3,
                     (int)local_100);
          tcu::TestNode::addChild(pTVar11,(TestNode *)pBVar17);
          std::__cxx11::string::~string((string *)&local_128);
        }
        pBVar17 = (BlockMultiNestedStructCase *)operator_new(0xc0);
        pCVar5 = (this->super_TestCaseGroup).m_context;
        std::operator+(&local_128,&baseName,"_mixed");
        BlockMultiNestedStructCase::BlockMultiNestedStructCase
                  (pBVar17,pCVar5,local_128._M_dataplus._M_p,"",uVar26,uVar19,BVar3,(int)local_100);
        tcu::TestNode::addChild(pTVar11,(TestNode *)pBVar17);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&baseName);
        pTVar25 = local_b0;
        iVar23 = (int)local_f0;
      }
      pTVar21 = (TestNode *)((long)&local_e8->_vptr_TestNode + 1);
    }
    pTVar8 = (TestNode *)((long)&pTVar25->_vptr_TestNode + 1);
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar4,"random","Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc0,0x19,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",BUFFERMODE_PER_BLOCK,0x3fc1,0x19,0x19
            );
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc3,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fc7,0x19,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fe3,0x19,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcb,0x19,100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fcf,0x19,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             BUFFERMODE_PER_BLOCK,0x7feb,0x19,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",BUFFERMODE_PER_BLOCK,0x7fef,0x19,
             0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",BUFFERMODE_PER_BLOCK,0xffff7fff,0x32,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar11,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",BUFFERMODE_SINGLE,0xffff7fff,0x32,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init (void)
{
	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4,
		glu::TYPE_BOOL,
		glu::TYPE_BOOL_VEC2,
		glu::TYPE_BOOL_VEC3,
		glu::TYPE_BOOL_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} precisionFlags[] =
	{
		{ "lowp",		PRECISION_LOW		},
		{ "mediump",	PRECISION_MEDIUM	},
		{ "highp",		PRECISION_HIGH		}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} layoutFlags[] =
	{
		{ "shared",		LAYOUT_SHARED	},
		{ "packed",		LAYOUT_PACKED	},
		{ "std140",		LAYOUT_STD140	}
	};

	static const struct
	{
		const char*		name;
		deUint32		flags;
	} matrixFlags[] =
	{
		{ "row_major",		LAYOUT_ROW_MAJOR	},
		{ "column_major",	LAYOUT_COLUMN_MAJOR }
	};

	static const struct
	{
		const char*							name;
		UniformBlockCase::BufferMode		mode;
	} bufferModes[] =
	{
		{ "per_block_buffer",	UniformBlockCase::BUFFERMODE_PER_BLOCK },
		{ "single_buffer",		UniformBlockCase::BUFFERMODE_SINGLE	}
	};

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);

				if (glu::isDataTypeBoolOrBVec(type))
					createBlockBasicTypeCases(layoutGroup, m_context, typeName, VarType(type, 0), layoutFlags[layoutFlagNdx].flags);
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(),
												  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags);
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" + typeName).c_str(),
													  VarType(type, precisionFlags[precNdx].flags), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type		= basicTypes[basicTypeNdx];
				const char*		typeName	= glu::getDataTypeName(type);
				const int		arraySize	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize),
										  layoutFlags[layoutFlagNdx].flags);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(VarType(type, PRECISION_HIGH), arraySize),
												  layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags);
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup = new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			singleNestedStructArrayGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockSingleNestedStructArrayCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType	type			= basicTypes[basicTypeNdx];
				const char*		typeName		= glu::getDataTypeName(type);
				const int		numInstances	= 3;

				createBlockBasicTypeCases(layoutGroup, m_context, typeName,
										  VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH),
										  layoutFlags[layoutFlagNdx].flags, numInstances);

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						createBlockBasicTypeCases(layoutGroup, m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(),
												  VarType(type, PRECISION_HIGH), layoutFlags[layoutFlagNdx].flags|matrixFlags[matFlagNdx].flags,
												  numInstances);
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup = new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_vertex").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiBasicTypesCase(m_context, (baseName + "_mixed").c_str(),		"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup = new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string	baseName	= layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags	= layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_vertex").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_VERTEX,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_fragment").c_str(),	"", baseFlags|DECLARE_FRAGMENT,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_both").c_str(),		"", baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	baseFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	bufferModes[modeNdx].mode, isArray ? 3 : 0));

					modeGroup->addChild(new BlockMultiNestedStructCase(m_context, (baseName + "_mixed").c_str(),	"", baseFlags|DECLARE_VERTEX,					baseFlags|DECLARE_FRAGMENT,					bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32	allShaders		= FEATURE_VERTEX_BLOCKS|FEATURE_FRAGMENT_BLOCKS|FEATURE_SHARED_BLOCKS;
		const deUint32	allLayouts		= FEATURE_PACKED_LAYOUT|FEATURE_SHARED_LAYOUT|FEATURE_STD140_LAYOUT;
		const deUint32	allBasicTypes	= FEATURE_VECTORS|FEATURE_MATRICES;
		const deUint32	unused			= FEATURE_UNUSED_MEMBERS|FEATURE_UNUSED_UNIFORMS;
		const deUint32	matFlags		= FEATURE_MATRIX_LAYOUT;
		const deUint32	allFeatures		= ~FEATURE_ARRAYS_OF_ARRAYS;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types",	"Scalar types only, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused,										25, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types",	"Scalar and vector types only, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|FEATURE_VECTORS,						25, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types",	"All basic types, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders|allLayouts|unused|allBasicTypes|matFlags,				25, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays",	"Arrays, per-block buffers",						UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_ARRAYS,	25, 50);

		createRandomCaseGroup(randomGroup, m_context, "basic_instance_arrays",					"Basic instance arrays, per-block buffers",				UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_INSTANCE_ARRAYS,								25, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs",							"Nested structs, per-block buffers",					UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS,										25, 100);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays",					"Nested structs, arrays, per-block buffers",			UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS,							25, 150);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_instance_arrays",			"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_INSTANCE_ARRAYS,				25, 125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",	"Nested structs, instance arrays, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allShaders|allLayouts|unused|allBasicTypes|matFlags|FEATURE_STRUCTS|FEATURE_ARRAYS|FEATURE_INSTANCE_ARRAYS,	25, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers",	"All random features, per-block buffers",	UniformBlockCase::BUFFERMODE_PER_BLOCK,	allFeatures,	50, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer",		"All random features, shared buffer",		UniformBlockCase::BUFFERMODE_SINGLE,	allFeatures,	50, 250);
	}
}